

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O1

void __thiscall QString::QString(QString *this,QLatin1StringView latin1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  qsizetype qVar5;
  storage_type *psVar6;
  char *__s;
  storage_type *psVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  undefined8 local_38;
  undefined8 uStack_30;
  qsizetype local_28;
  long local_20;
  
  __s = latin1.m_data;
  psVar7 = (storage_type *)latin1.m_size;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  psVar6 = (storage_type *)0x0;
  if (0 < (long)psVar7) {
    psVar6 = psVar7;
  }
  if (__s == (char *)0x0) {
    psVar6 = (storage_type *)0x0;
  }
  if (__s != (char *)0x0 && (long)psVar7 < 0) {
    psVar6 = (storage_type *)strlen(__s);
  }
  QVar8.m_data = psVar6;
  QVar8.m_size = (qsizetype)&local_38;
  ::QString::fromLatin1(QVar8);
  qVar5 = local_28;
  uVar1 = (undefined4)local_38;
  uVar2 = local_38._4_4_;
  uVar3 = (undefined4)uStack_30;
  uVar4 = uStack_30._4_4_;
  local_38 = 0;
  uStack_30 = 0;
  *(undefined4 *)&(this->d).d = uVar1;
  *(undefined4 *)((long)&(this->d).d + 4) = uVar2;
  *(undefined4 *)&(this->d).ptr = uVar3;
  *(undefined4 *)((long)&(this->d).ptr + 4) = uVar4;
  local_28 = 0;
  (this->d).size = qVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QString::QString(QLatin1StringView latin1)
    : QString{QString::fromLatin1(latin1.data(), latin1.size())} {}